

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

attr_list INT_EVdfg_get_attr_list(EVdfg_stone stone)

{
  EVdfg_configuration p_Var1;
  EVdfg_stone_state p_Var2;
  long lVar3;
  
  p_Var1 = stone->dfg->deployed_state;
  if ((p_Var1 != (EVdfg_configuration)0x0) && (0 < (long)p_Var1->stone_count)) {
    lVar3 = 0;
    do {
      p_Var2 = p_Var1->stones[lVar3];
      if (p_Var2->stone_id == stone->stone_id) goto LAB_00141a6d;
      lVar3 = lVar3 + 1;
    } while (p_Var1->stone_count != lVar3);
  }
  if ((stone->dfg->working_state != (EVdfg_configuration)0x0) && (0 < (long)p_Var1->stone_count)) {
    lVar3 = 0;
    while (p_Var2 = p_Var1->stones[lVar3], p_Var2->stone_id != stone->stone_id) {
      lVar3 = lVar3 + 1;
      if (p_Var1->stone_count == lVar3) {
        return (attr_list)0x0;
      }
    }
LAB_00141a6d:
    if (p_Var2->attrs != (attr_list)0x0) {
      add_ref_attr_list();
      return p_Var2->attrs;
    }
  }
  return (attr_list)0x0;
}

Assistant:

extern attr_list
INT_EVdfg_get_attr_list(EVdfg_stone stone)
{
    if (stone->dfg->deployed_state) {
	EVdfg_stone_state dstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (dstone) {
	    if (dstone->attrs) add_ref_attr_list(dstone->attrs);
	    return dstone->attrs;
	}
    }
    if (stone->dfg->working_state) {
	EVdfg_stone_state wstone = find_stone_state(stone->stone_id, stone->dfg->deployed_state);
	if (wstone) {
	    if (wstone->attrs) add_ref_attr_list(wstone->attrs);
	    return wstone->attrs;
	}
    }	
    return NULL;
}